

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  bool bVar1;
  Result result;
  reference pvVar2;
  reference ppEVar3;
  reference pvVar4;
  reference pEVar5;
  iterator local_180;
  iterator local_170;
  reference local_160;
  value_type *iter_5;
  TryExpr *try_expr_1;
  iterator local_148;
  iterator local_138;
  reference local_128;
  value_type *iter_4;
  TryExpr *try_expr;
  iterator local_110;
  iterator local_100;
  reference local_f0;
  value_type *iter_3;
  BlockExprBase<(wabt::ExprType)25> *loop_expr;
  iterator local_d8;
  iterator local_c8;
  reference local_b8;
  value_type *iter_2;
  IfExpr *if_expr_1;
  iterator local_a0;
  iterator local_90;
  reference local_80;
  value_type *iter_1;
  IfExpr *if_expr;
  iterator local_68;
  iterator local_58;
  reference local_48;
  value_type *iter;
  BlockExprBase<(wabt::ExprType)7> *block_expr;
  Expr *local_30;
  Expr *expr;
  Expr *pEStack_20;
  State state;
  Expr *root_expr_local;
  ExprVisitor *this_local;
  
  pEStack_20 = root_expr;
  root_expr_local = (Expr *)this;
  std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::clear
            (&this->state_stack_);
  std::vector<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>::clear(&this->expr_stack_);
  std::
  vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ::clear(&this->expr_iter_stack_);
  PushDefault(this,pEStack_20);
  do {
    bVar1 = std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::empty
                      (&this->state_stack_);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    pvVar2 = std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::back
                       (&this->state_stack_);
    expr._4_4_ = *pvVar2;
    ppEVar3 = std::vector<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>::back(&this->expr_stack_);
    local_30 = *ppEVar3;
    switch(expr._4_4_) {
    case Default:
      PopDefault(this);
      block_expr._4_4_ = HandleDefaultState(this,local_30);
      bVar1 = Failed(block_expr._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      break;
    case Block:
      iter = (value_type *)cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(local_30);
      pvVar4 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_48 = pvVar4;
      local_58 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter + 0xe));
      bVar1 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar4,local_58);
      if (bVar1) {
        local_68 = intrusive_list<wabt::Expr>::iterator::operator++(local_48,0);
        pEVar5 = intrusive_list<wabt::Expr>::iterator::operator*(&local_68);
        PushDefault(this,pEVar5);
      }
      else {
        if_expr._4_4_ = (*this->delegate_->_vptr_Delegate[4])();
        bVar1 = Failed(if_expr._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
      }
      break;
    case IfTrue:
      iter_1 = (value_type *)cast<wabt::IfExpr,wabt::Expr>(local_30);
      pvVar4 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_80 = pvVar4;
      local_90 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter_1 + 0xe));
      bVar1 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar4,local_90);
      if (bVar1) {
        local_a0 = intrusive_list<wabt::Expr>::iterator::operator++(local_80,0);
        pEVar5 = intrusive_list<wabt::Expr>::iterator::operator*(&local_a0);
        PushDefault(this,pEVar5);
      }
      else {
        if_expr_1._4_4_ = (*this->delegate_->_vptr_Delegate[0x12])(this->delegate_,iter_1);
        bVar1 = Failed(if_expr_1._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
        PushExprlist(this,IfFalse,local_30,(ExprList *)&iter_1[0x11].node_);
      }
      break;
    case IfFalse:
      iter_2 = (value_type *)cast<wabt::IfExpr,wabt::Expr>(local_30);
      pvVar4 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_b8 = pvVar4;
      local_c8 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)&iter_2[0x11].node_);
      bVar1 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar4,local_c8);
      if (bVar1) {
        local_d8 = intrusive_list<wabt::Expr>::iterator::operator++(local_b8,0);
        pEVar5 = intrusive_list<wabt::Expr>::iterator::operator*(&local_d8);
        PushDefault(this,pEVar5);
      }
      else {
        loop_expr._4_4_ = (*this->delegate_->_vptr_Delegate[0x13])();
        bVar1 = Failed(loop_expr._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
      }
      break;
    case Loop:
      iter_3 = (value_type *)cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(local_30);
      pvVar4 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_f0 = pvVar4;
      local_100 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter_3 + 0xe));
      bVar1 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar4,local_100);
      if (bVar1) {
        local_110 = intrusive_list<wabt::Expr>::iterator::operator++(local_f0,0);
        pEVar5 = intrusive_list<wabt::Expr>::iterator::operator*(&local_110);
        PushDefault(this,pEVar5);
      }
      else {
        try_expr._4_4_ = (*this->delegate_->_vptr_Delegate[0x19])();
        bVar1 = Failed(try_expr._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
      }
      break;
    case Try:
      iter_4 = (value_type *)cast<wabt::TryExpr,wabt::Expr>(local_30);
      pvVar4 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_128 = pvVar4;
      local_138 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter_4 + 0xe));
      bVar1 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar4,local_138);
      if (bVar1) {
        local_148 = intrusive_list<wabt::Expr>::iterator::operator++(local_128,0);
        pEVar5 = intrusive_list<wabt::Expr>::iterator::operator*(&local_148);
        PushDefault(this,pEVar5);
      }
      else {
        try_expr_1._4_4_ = (*this->delegate_->_vptr_Delegate[0x34])(this->delegate_,iter_4);
        bVar1 = Failed(try_expr_1._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
        bVar1 = intrusive_list<wabt::Expr>::empty((intrusive_list<wabt::Expr> *)&iter_4[0x11].node_)
        ;
        if (bVar1) {
          try_expr_1._0_4_ = (*this->delegate_->_vptr_Delegate[0x35])();
          bVar1 = Failed(try_expr_1._0_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        else {
          PushExprlist(this,Catch,local_30,(ExprList *)&iter_4[0x11].node_);
        }
      }
      break;
    case Catch:
      iter_5 = (value_type *)cast<wabt::TryExpr,wabt::Expr>(local_30);
      pvVar4 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_160 = pvVar4;
      local_170 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)&iter_5[0x11].node_)
      ;
      bVar1 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar4,local_170);
      if (bVar1) {
        local_180 = intrusive_list<wabt::Expr>::iterator::operator++(local_160,0);
        pEVar5 = intrusive_list<wabt::Expr>::iterator::operator*(&local_180);
        PushDefault(this,pEVar5);
      }
      else {
        result.enum_ = (*this->delegate_->_vptr_Delegate[0x35])();
        bVar1 = Failed(result);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
      }
    }
  } while( true );
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->OnCatchExpr(try_expr));
          PopExprlist();
          if (try_expr->catch_.empty()) {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          } else {
            PushExprlist(State::Catch, expr, try_expr->catch_);
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catch_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          PopExprlist();
        }
        break;
      }
    }
  }

  return Result::Ok;
}